

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_renderer.cpp
# Opt level: O3

void __thiscall dpfb::FontRendererCreator::FontRendererCreator(FontRendererCreator *this,char *name)

{
  int iVar1;
  FontRendererCreator *pFVar2;
  FontRendererCreator **ppFVar3;
  FontRendererCreator *pFVar4;
  
  this->_vptr_FontRendererCreator = (_func_int **)&PTR__FontRendererCreator_00127808;
  this->name = name;
  pFVar2 = find(name);
  pFVar4 = list;
  if (pFVar2 != (FontRendererCreator *)0x0) {
    dpfb::FontRendererCreator((dpfb *)name);
    return;
  }
  ppFVar3 = &list;
  if (list == (FontRendererCreator *)0x0) {
    pFVar4 = (FontRendererCreator *)0x0;
  }
  else {
    iVar1 = strcmp(list->name,name);
    if (iVar1 < 0) {
      do {
        pFVar2 = pFVar4;
        pFVar4 = pFVar2->next;
        if (pFVar4 == (FontRendererCreator *)0x0) {
          pFVar4 = (FontRendererCreator *)0x0;
          break;
        }
        iVar1 = strcmp(pFVar4->name,name);
      } while (iVar1 < 0);
      ppFVar3 = &pFVar2->next;
    }
  }
  this->next = pFVar4;
  *ppFVar3 = this;
  return;
}

Assistant:

FontRendererCreator::FontRendererCreator(const char* name)
    : name {name}
{
    LINK_PLUGIN(FontRendererCreator);
}